

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgDreamSample.hpp
# Opt level: O0

void TasDREAM::SampleDREAM<(TasDREAM::TypeSamplingForm)1>
               (int num_burnup,int num_collect,DreamPDF *probability_distribution,
               DreamDomain *inside,TasmanianDREAM *state,
               function<void_(std::vector<double,_std::allocator<double>_>_&)> *independent_update,
               function<double_()> *differential_update,function<double_()> *get_random01)

{
  pointer *ppdVar1;
  _Bit_pointer *this;
  allocator<double> *paVar2;
  pointer pdVar3;
  function<void_(std::vector<double,_std::allocator<double>_>_&)> *pfVar4;
  bool bVar5;
  int iVar6;
  runtime_error *this_00;
  int *piVar7;
  ulong uVar8;
  vector *pvVar9;
  iterator __first;
  iterator __last;
  size_type sVar10;
  reference pdVar11;
  reference pvVar12;
  size_t sVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  undefined1 auVar17 [16];
  reference rVar18;
  reference local_220;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_210;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_208;
  double *local_200;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_1f8;
  double *local_1f0;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_1e8;
  reference local_1e0;
  reference local_1d0;
  byte local_1b9;
  int iStack_1b8;
  bool keep_new;
  size_t i_1;
  size_t accepted;
  iterator ival;
  iterator icand;
  undefined1 local_190 [8];
  vector<double,_std::allocator<double>_> new_values;
  undefined1 local_170 [8];
  vector<double,_std::allocator<double>_> new_state;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_130;
  const_iterator local_128;
  vector *local_120;
  size_t kindex;
  size_t jindex;
  undefined1 local_108 [8];
  vector<double,_std::allocator<double>_> propose;
  size_t i;
  undefined1 local_e0 [8];
  vector<bool,_std::allocator<bool>_> valid;
  vector<double,_std::allocator<double>_> values;
  vector<double,_std::allocator<double>_> candidates;
  int t;
  int local_7c;
  undefined1 local_78 [4];
  int total_iterations;
  double local_48;
  double unitlength;
  size_t num_dimensions;
  size_t num_chains;
  function<void_(std::vector<double,_std::allocator<double>_>_&)> *independent_update_local;
  TasmanianDREAM *state_local;
  DreamDomain *inside_local;
  DreamPDF *probability_distribution_local;
  int num_collect_local;
  int num_burnup_local;
  
  num_chains = (size_t)independent_update;
  independent_update_local =
       (function<void_(std::vector<double,_std::allocator<double>_>_&)> *)state;
  state_local = (TasmanianDREAM *)inside;
  inside_local = (DreamDomain *)probability_distribution;
  probability_distribution_local._0_4_ = num_collect;
  probability_distribution_local._4_4_ = num_burnup;
  iVar6 = TasmanianDREAM::getNumChains(state);
  num_dimensions = (size_t)iVar6;
  iVar6 = TasmanianDREAM::getNumDimensions((TasmanianDREAM *)independent_update_local);
  unitlength = (double)(long)iVar6;
  auVar17._8_4_ = (int)(num_dimensions >> 0x20);
  auVar17._0_8_ = num_dimensions;
  auVar17._12_4_ = 0x45300000;
  local_48 = (auVar17._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)num_dimensions) - 4503599627370496.0);
  if (num_dimensions != 0) {
    bVar5 = TasmanianDREAM::isStateReady((TasmanianDREAM *)independent_update_local);
    if (!bVar5) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this_00,
                 "ERROR: DREAM sampling requires that the setState() has been called first on the TasmanianDREAM."
                );
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    bVar5 = TasmanianDREAM::isPDFReady((TasmanianDREAM *)independent_update_local);
    pfVar4 = independent_update_local;
    if (!bVar5) {
      std::
      function<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&)>
      ::function((function<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&)>
                  *)local_78,probability_distribution);
      TasDREAM::TasmanianDREAM::setPDFvalues
                (pfVar4,(function<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&)>
                         *)local_78);
      std::
      function<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&)>
      ::~function((function<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&)>
                   *)local_78);
    }
    if (0 < (int)probability_distribution_local) {
      TasDREAM::TasmanianDREAM::expandHistory((int)independent_update_local);
    }
    t = 0;
    piVar7 = std::max<int>((int *)((long)&probability_distribution_local + 4),&t);
    iVar6 = *piVar7;
    candidates.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ = 0;
    piVar7 = std::max<int>((int *)&probability_distribution_local,
                           (int *)((long)&candidates.
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
    local_7c = iVar6 + *piVar7;
    for (candidates.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
        (int)candidates.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage < local_7c;
        candidates.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_4_ =
             (int)candidates.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage + 1) {
      ppdVar1 = &values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)ppdVar1);
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)
                 &valid.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                  _M_end_of_storage);
      std::vector<double,_std::allocator<double>_>::reserve
                ((vector<double,_std::allocator<double>_> *)ppdVar1,
                 num_dimensions * (long)unitlength);
      std::vector<double,_std::allocator<double>_>::reserve
                ((vector<double,_std::allocator<double>_> *)
                 &valid.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                  _M_end_of_storage,num_dimensions);
      sVar13 = num_dimensions;
      i._7_1_ = 1;
      std::allocator<bool>::allocator((allocator<bool> *)((long)&i + 6));
      std::vector<bool,_std::allocator<bool>_>::vector
                ((vector<bool,_std::allocator<bool>_> *)local_e0,sVar13,(bool *)((long)&i + 7),
                 (allocator<bool> *)((long)&i + 6));
      std::allocator<bool>::~allocator((allocator<bool> *)((long)&i + 6));
      for (propose.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage = (pointer)0x0; dVar14 = unitlength,
          propose.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage < num_dimensions;
          propose.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)((long)propose.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage + 1)) {
        std::allocator<double>::allocator((allocator<double> *)((long)&jindex + 7));
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)local_108,(size_type)dVar14,
                   (allocator<double> *)((long)&jindex + 7));
        std::allocator<double>::~allocator((allocator<double> *)((long)&jindex + 7));
        dVar14 = std::function<double_()>::operator()(get_random01);
        uVar8 = (ulong)(dVar14 * local_48);
        kindex = uVar8 | (long)(dVar14 * local_48 - 9.223372036854776e+18) & (long)uVar8 >> 0x3f;
        dVar14 = std::function<double_()>::operator()(get_random01);
        pfVar4 = independent_update_local;
        pdVar3 = propose.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
        uVar8 = (ulong)(dVar14 * local_48);
        pvVar9 = (vector *)
                 (uVar8 | (long)(dVar14 * local_48 - 9.223372036854776e+18) & (long)uVar8 >> 0x3f);
        if (num_dimensions <= kindex) {
          kindex = num_dimensions - 1;
        }
        if (num_dimensions <= pvVar9) {
          kindex = num_dimensions - 1;
        }
        sVar13 = kindex;
        local_120 = pvVar9;
        dVar14 = std::function<double_()>::operator()(differential_update);
        TasDREAM::TasmanianDREAM::getIJKdelta((ulong)pfVar4,(ulong)pdVar3,sVar13,dVar14,pvVar9);
        std::function<void_(std::vector<double,_std::allocator<double>_>_&)>::operator()
                  (independent_update,(vector<double,_std::allocator<double>_> *)local_108);
        bVar5 = std::function<bool_(const_std::vector<double,_std::allocator<double>_>_&)>::
                operator()(inside,(vector<double,_std::allocator<double>_> *)local_108);
        if (bVar5) {
          ppdVar1 = &values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
          local_130._M_current =
               (double *)
               std::vector<double,_std::allocator<double>_>::end
                         ((vector<double,_std::allocator<double>_> *)ppdVar1);
          __gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>::
          __normal_iterator<double*>
                    ((__normal_iterator<double_const*,std::vector<double,std::allocator<double>>> *)
                     &local_128,&local_130);
          __first = std::vector<double,_std::allocator<double>_>::begin
                              ((vector<double,_std::allocator<double>_> *)local_108);
          __last = std::vector<double,_std::allocator<double>_>::end
                             ((vector<double,_std::allocator<double>_> *)local_108);
          std::vector<double,std::allocator<double>>::
          insert<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,void>
                    ((vector<double,std::allocator<double>> *)ppdVar1,local_128,
                     (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                     __first._M_current,
                     (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                     __last._M_current);
          this = &valid.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                  _M_end_of_storage;
          sVar10 = std::vector<double,_std::allocator<double>_>::size
                             ((vector<double,_std::allocator<double>_> *)this);
          std::vector<double,_std::allocator<double>_>::resize
                    ((vector<double,_std::allocator<double>_> *)this,sVar10 + 1);
        }
        else {
          rVar18 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             ((vector<bool,_std::allocator<bool>_> *)local_e0,
                              (size_type)
                              propose.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage);
          new_state.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)rVar18._M_p;
          std::_Bit_reference::operator=
                    ((_Bit_reference *)
                     &new_state.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,false);
        }
        std::vector<double,_std::allocator<double>_>::~vector
                  ((vector<double,_std::allocator<double>_> *)local_108);
      }
      bVar5 = std::vector<double,_std::allocator<double>_>::empty
                        ((vector<double,_std::allocator<double>_> *)
                         &values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
      if (!bVar5) {
        std::
        function<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&)>
        ::operator()(probability_distribution,
                     (vector<double,_std::allocator<double>_> *)
                     &values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,
                     (vector<double,_std::allocator<double>_> *)
                     &valid.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_end_of_storage);
      }
      sVar10 = num_dimensions * (long)unitlength;
      paVar2 = (allocator<double> *)
               ((long)&new_values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7);
      std::allocator<double>::allocator(paVar2);
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)local_170,sVar10,paVar2);
      std::allocator<double>::~allocator
                ((allocator<double> *)
                 ((long)&new_values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 7));
      sVar13 = num_dimensions;
      paVar2 = (allocator<double> *)((long)&icand._M_current + 7);
      std::allocator<double>::allocator(paVar2);
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)local_190,sVar13,paVar2);
      std::allocator<double>::~allocator((allocator<double> *)((long)&icand._M_current + 7));
      ival = std::vector<double,_std::allocator<double>_>::begin
                       ((vector<double,_std::allocator<double>_> *)
                        &values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
      accepted = (size_t)std::vector<double,_std::allocator<double>_>::begin
                                   ((vector<double,_std::allocator<double>_> *)
                                    &valid.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                     super__Bvector_impl_data._M_end_of_storage);
      i_1 = 0;
      for (_iStack_1b8 = 0; _iStack_1b8 < num_dimensions; _iStack_1b8 = _iStack_1b8 + 1) {
        rVar18 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           ((vector<bool,_std::allocator<bool>_> *)local_e0,_iStack_1b8);
        local_1d0 = rVar18;
        local_1b9 = std::_Bit_reference::operator_cast_to_bool(&local_1d0);
        rVar18 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           ((vector<bool,_std::allocator<bool>_> *)local_e0,_iStack_1b8);
        local_1e0 = rVar18;
        bVar5 = std::_Bit_reference::operator_cast_to_bool(&local_1e0);
        if (bVar5) {
          pdVar11 = __gnu_cxx::
                    __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                    operator*((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                               *)&accepted);
          dVar14 = *pdVar11;
          dVar15 = TasmanianDREAM::getPDFvalue
                             ((TasmanianDREAM *)independent_update_local,_iStack_1b8);
          if (dVar14 <= dVar15) {
            pdVar11 = __gnu_cxx::
                      __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                      operator*((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                 *)&accepted);
            dVar14 = *pdVar11;
            dVar15 = TasmanianDREAM::getPDFvalue
                               ((TasmanianDREAM *)independent_update_local,_iStack_1b8);
            dVar16 = std::function<double_()>::operator()(get_random01);
            dVar16 = log(dVar16);
            local_1b9 = dVar16 <= dVar14 - dVar15;
          }
          else {
            local_1b9 = 1;
          }
        }
        pfVar4 = independent_update_local;
        dVar14 = unitlength;
        if ((local_1b9 & 1) == 0) {
          sVar13 = (size_t)iStack_1b8;
          local_210._M_current =
               (double *)
               std::vector<double,_std::allocator<double>_>::begin
                         ((vector<double,_std::allocator<double>_> *)local_170);
          local_208 = __gnu_cxx::
                      __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                      operator+(&local_210,_iStack_1b8 * (long)unitlength);
          pdVar11 = __gnu_cxx::
                    __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                    operator*(&local_208);
          TasmanianDREAM::getChainState((TasmanianDREAM *)pfVar4,sVar13,pdVar11);
          dVar14 = TasmanianDREAM::getPDFvalue
                             ((TasmanianDREAM *)independent_update_local,_iStack_1b8);
          pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)local_190,_iStack_1b8);
          *pvVar12 = dVar14;
        }
        else {
          local_1e8._M_current = ival._M_current;
          local_1f8._M_current =
               (double *)
               std::vector<double,_std::allocator<double>_>::begin
                         ((vector<double,_std::allocator<double>_> *)local_170);
          local_1f0 = (double *)
                      __gnu_cxx::
                      __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                      operator+(&local_1f8,_iStack_1b8 * (long)unitlength);
          local_200 = (double *)
                      std::
                      copy_n<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,unsigned_long,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                                (local_1e8,(unsigned_long)dVar14,
                                 (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                  )local_1f0);
          pdVar11 = __gnu_cxx::
                    __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                    operator*((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                               *)&accepted);
          dVar14 = *pdVar11;
          pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)local_190,_iStack_1b8);
          *pvVar12 = dVar14;
          i_1 = i_1 + 1;
        }
        rVar18 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           ((vector<bool,_std::allocator<bool>_> *)local_e0,_iStack_1b8);
        local_220 = rVar18;
        bVar5 = std::_Bit_reference::operator_cast_to_bool(&local_220);
        if (bVar5) {
          std::
          advance<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,unsigned_long>
                    (&ival,(unsigned_long)unitlength);
          __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
          operator++((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
                     &accepted,0);
        }
      }
      TasDREAM::TasmanianDREAM::setState((vector *)independent_update_local);
      TasDREAM::TasmanianDREAM::setPDFvalues((vector *)independent_update_local);
      if (probability_distribution_local._4_4_ <=
          (int)candidates.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage) {
        TasDREAM::TasmanianDREAM::saveStateHistory((ulong)independent_update_local);
      }
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)local_190);
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)local_170);
      std::vector<bool,_std::allocator<bool>_>::~vector
                ((vector<bool,_std::allocator<bool>_> *)local_e0);
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)
                 &valid.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                  _M_end_of_storage);
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)
                 &values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
    }
  }
  return;
}

Assistant:

void SampleDREAM(int num_burnup, int num_collect,
                 DreamPDF probability_distribution,
                 DreamDomain inside,
                 TasmanianDREAM &state,
                 std::function<void(std::vector<double> &x)> independent_update = no_update,
                 std::function<double(void)> differential_update = const_one,
                 std::function<double(void)> get_random01 = tsgCoreUniform01){

    size_t num_chains = (size_t) state.getNumChains(), num_dimensions = (size_t) state.getNumDimensions();
    double unitlength = (double) num_chains;

    if (num_chains == 0) return; // no sampling with a null state

    if (!state.isStateReady()) throw std::runtime_error("ERROR: DREAM sampling requires that the setState() has been called first on the TasmanianDREAM.");

    if (!state.isPDFReady()) // initialize probability density (if not initialized already)
        state.setPDFvalues(probability_distribution);

    if (num_collect > 0) // pre-allocate memory for the new history
        state.expandHistory(num_collect);

    int total_iterations = std::max(num_burnup, 0) + std::max(num_collect, 0);
    for(int t = 0; t < total_iterations; t++){
        std::vector<double> candidates, values;
        candidates.reserve(num_chains * num_dimensions);
        values.reserve(num_chains);

        std::vector<bool> valid(num_chains, true); // keep track whether the samples need to be evaluated

        for(size_t i=0; i<num_chains; i++){
            std::vector<double> propose(num_dimensions);

            size_t jindex = (size_t) (get_random01() * unitlength);
            size_t kindex = (size_t) (get_random01() * unitlength);
            if (jindex >= num_chains) jindex = num_chains - 1; // this is needed in case get_random01() returns 1
            if (kindex >= num_chains) jindex = num_chains - 1;

            state.getIJKdelta(i, jindex, kindex, differential_update(), propose); // propose = s_i + w ( s_k - s_j)
            independent_update(propose); // propose += correction

            if (inside(propose)){
                candidates.insert(candidates.end(), propose.begin(), propose.end());
                values.resize(values.size() + 1);
            }else{
                valid[i] = false;
            }
        }

        if (!candidates.empty()) // block the pathological case of all proposals leaving the domain
            probability_distribution(candidates, values);

        std::vector<double> new_state(num_chains * num_dimensions), new_values(num_chains);

        auto icand = candidates.begin(); // loop over all candidates and values, accept or reject
        auto ival = values.begin();

        size_t accepted = 0;

        for(size_t i=0; i<num_chains; i++){
            bool keep_new = valid[i]; // if not valid, automatically reject
            if (valid[i]){ // apply random test
                if (*ival > state.getPDFvalue(i)){ // if the new value has higher probability, automatically accept
                    keep_new = true;
                }else{
                    if (form == regform){
                        keep_new = (*ival / state.getPDFvalue(i) >= get_random01()); // keep if the new value has higher probability
                    }else{
                        keep_new = (*ival - state.getPDFvalue(i) >= log(get_random01()));
                    }
                    //std::cout << "Trsh = " << *ival / state.getPDFvalue(i) << "   " << ((keep_new) ? "Accept" : "Reject") << std:: endl;
                }
            }

            if (keep_new){
                std::copy_n(icand, num_dimensions, new_state.begin() + i * num_dimensions);
                new_values[i] = *ival;
                accepted++; // accepted one more proposal
            }else{ // reject and reuse the old state
                state.getChainState((int) i, &*(new_state.begin() + i * num_dimensions));
                new_values[i] = state.getPDFvalue(i);
            }

            if (valid[i]){ // kept or rejected, if this sample was valid then move to the next sample in the list
                std::advance(icand, num_dimensions);
                ival++;
            }
        }

        state.setState(new_state);
        state.setPDFvalues(new_values);

        if (t >= num_burnup)
            state.saveStateHistory(accepted);
    }
}